

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

byte_vec_t *
sfc::pack_native_tile
          (byte_vec_t *__return_storage_ptr__,index_vec_t *data,Mode mode,uint bpp,uint width,
          uint height)

{
  iterator iVar1;
  iterator iVar2;
  v10 *pvVar3;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar4;
  undefined1 auVar5 [12];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_718;
  const_iterator local_710;
  undefined1 local_708 [8];
  byte_vec_t plane_2;
  uint p;
  v10 *local_6c8;
  char *local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  byte_vec_t local_698;
  undefined1 local_679;
  string local_678;
  v10 *local_658;
  char *local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  byte_vec_t local_628;
  undefined1 local_609;
  string local_608;
  v10 *local_5e8;
  char *local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b1;
  string local_5b0;
  v10 *local_590;
  char *local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  byte_vec_t local_560;
  byte_vec_t local_548;
  undefined1 local_529;
  string local_528;
  v10 *local_508;
  char *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  uchar *local_4d8;
  uchar *local_4d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4c0;
  const_iterator local_4b8;
  undefined1 local_4b0 [8];
  byte_vec_t plane_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_480;
  const_iterator local_478;
  undefined1 local_470 [8];
  byte_vec_t plane;
  uint i;
  uint planes;
  string local_440;
  v10 *local_420;
  char *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3ee;
  anon_class_1_0_00000001 local_3ed;
  anon_class_1_0_00000001 local_3ec;
  anon_class_1_0_00000001 local_3eb;
  anon_class_1_0_00000001 local_3ea;
  anon_class_1_0_00000001 local_3e9;
  uint uStack_3e8;
  anon_class_1_0_00000001 make_2bpp_bitpack;
  anon_class_1_0_00000001 make_4bpp_bitpack;
  anon_class_1_0_00000001 make_1bit_planes;
  anon_class_1_0_00000001 make_2bit_planes;
  anon_class_1_0_00000001 make_4bit_planes;
  uint height_local;
  uint width_local;
  uint bpp_local;
  Mode mode_local;
  index_vec_t *data_local;
  byte_vec_t *nd;
  undefined1 local_3b8 [16];
  v10 *local_3a8;
  char *local_3a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_398;
  v10 *local_390;
  char *pcStack_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_378 [2];
  undefined1 local_368 [16];
  v10 *local_358;
  char *local_350;
  string *local_348;
  v10 *local_340;
  char *pcStack_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_328 [2];
  undefined1 local_318 [16];
  v10 *local_308;
  char *local_300;
  string *local_2f8;
  v10 *local_2f0;
  char *pcStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d8 [2];
  undefined1 local_2c8 [16];
  v10 *local_2b8;
  char *local_2b0;
  string *local_2a8;
  v10 *local_2a0;
  char *pcStack_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_288 [2];
  undefined1 local_278 [16];
  v10 *local_268;
  char *local_260;
  string *local_258;
  v10 *local_250;
  char *pcStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_238 [3];
  undefined1 local_220 [16];
  v10 *local_210;
  char *local_208;
  string *local_200;
  v10 *local_1f8;
  char *pcStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  v10 **local_1e0;
  v10 *local_1d8;
  char *pcStack_1d0;
  v10 **local_1c0;
  v10 *local_1b8;
  char *pcStack_1b0;
  v10 **local_1a0;
  v10 *local_198;
  char *pcStack_190;
  v10 **local_180;
  v10 *local_178;
  char *pcStack_170;
  v10 **local_160;
  v10 *local_158;
  char *pcStack_150;
  v10 **local_140;
  v10 *local_138;
  char *pcStack_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_128;
  undefined1 *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_118;
  undefined1 *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_e8;
  undefined1 *local_e0;
  byte_vec_t **local_d8;
  undefined1 *local_d0;
  byte_vec_t **local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  byte_vec_t **local_98;
  undefined8 local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  aVar4._4_4_ = in_register_0000008c;
  aVar4._0_4_ = height;
  local_3e9 = (anon_class_1_0_00000001)0x0;
  local_3ea = (anon_class_1_0_00000001)0x0;
  local_3eb = (anon_class_1_0_00000001)0x0;
  local_3ec = (anon_class_1_0_00000001)0x0;
  local_3ed = (anon_class_1_0_00000001)0x0;
  local_3ee = 0;
  uStack_3e8 = height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if ((((mode == snes) || (mode == gb)) || (mode == gbc)) || (mode == pce)) {
    if ((width != 8) || (uStack_3e8 != 8)) {
      auVar5 = __cxa_allocate_exception(0x10);
      local_420 = (v10 *)0x1d8ffc;
      local_418 = (char *)0x48;
      pvVar3 = (v10 *)(ulong)mode;
      mode_abi_cxx11_(&local_440,(sfc *)pvVar3,auVar5._8_4_);
      local_1e8 = &local_410;
      local_1f8 = local_420;
      pcStack_1f0 = local_418;
      local_200 = &local_440;
      local_1e0 = &local_1f8;
      local_210 = local_420;
      local_208 = local_418;
      local_1d8 = local_210;
      pcStack_1d0 = local_208;
      local_238[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_200,pvVar3,local_1e8);
      local_120 = local_220;
      local_128 = local_238;
      local_18 = 0xd;
      fmt.size_ = 0xd;
      fmt.data_ = local_208;
      args.field_1.values_ = aVar4.values_;
      args.desc_ = (unsigned_long_long)local_128;
      local_a0 = local_128;
      local_20 = local_128;
      local_10 = local_120;
      ::fmt::v10::vformat_abi_cxx11_(&local_410,local_210,fmt,args);
      std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_410);
      __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = bpp >> 1;
    for (plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage <
        plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
        plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) {
      pack_native_tile::anon_class_1_0_00000001::operator()
                ((byte_vec_t *)local_470,&local_3ea,data,
                 (uint)plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage * 2);
      local_480._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_478,&local_480);
      iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
      iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
      plane_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                               __return_storage_ptr__,local_478,
                               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )iVar1._M_current,
                               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )iVar2._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
    }
    if (bpp == 1) {
      pack_native_tile::anon_class_1_0_00000001::operator()
                ((byte_vec_t *)local_4b0,&local_3eb,data,0,true);
      local_4c0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_4b8,&local_4c0);
      local_4c8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
      local_4d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_4b0);
      local_4d8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                      __return_storage_ptr__,local_4b8,local_4c8,
                                      (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_4d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
    }
  }
  else if (((mode == ws) || (mode == wsc)) || ((mode == gg || (mode == sms)))) {
    if ((width != 8) || (uStack_3e8 != 8)) {
      local_529 = 1;
      auVar5 = __cxa_allocate_exception(0x10);
      local_508 = (v10 *)0x1d8ffc;
      local_500 = (char *)0x48;
      pvVar3 = (v10 *)(ulong)mode;
      mode_abi_cxx11_(&local_528,(sfc *)pvVar3,auVar5._8_4_);
      local_240 = &local_4f8;
      local_250 = local_508;
      pcStack_248 = local_500;
      local_258 = &local_528;
      local_1c0 = &local_250;
      local_268 = local_508;
      local_260 = local_500;
      local_1b8 = local_268;
      pcStack_1b0 = local_260;
      local_288[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_258,pvVar3,local_240);
      local_110 = local_278;
      local_118 = local_288;
      local_30 = 0xd;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_260;
      args_00.field_1.values_ = aVar4.values_;
      args_00.desc_ = (unsigned_long_long)local_118;
      local_a8 = local_118;
      local_38 = local_118;
      local_28 = local_110;
      ::fmt::v10::vformat_abi_cxx11_(&local_4f8,local_268,fmt_00,args_00);
      std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_4f8);
      local_529 = 0;
      __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp == 4) {
      pack_native_tile::anon_class_1_0_00000001::operator()(&local_548,&local_3e9,data,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&local_548);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_548);
    }
    else {
      if (bpp != 2) {
        local_5b1 = 1;
        auVar5 = __cxa_allocate_exception(0x10);
        local_590 = (v10 *)0x1d8f95;
        local_588 = (char *)0x30;
        pvVar3 = (v10 *)(ulong)mode;
        mode_abi_cxx11_(&local_5b0,(sfc *)pvVar3,auVar5._8_4_);
        local_290 = &local_580;
        local_2a0 = local_590;
        pcStack_298 = local_588;
        local_2a8 = &local_5b0;
        local_1a0 = &local_2a0;
        local_2b8 = local_590;
        local_2b0 = local_588;
        local_198 = local_2b8;
        pcStack_190 = local_2b0;
        local_2d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2a8,pvVar3,local_290);
        local_100 = local_2c8;
        local_108 = local_2d8;
        local_48 = 0xd;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = local_2b0;
        args_01.field_1.values_ = aVar4.values_;
        args_01.desc_ = (unsigned_long_long)local_108;
        local_b0 = local_108;
        local_50 = local_108;
        local_40 = local_100;
        ::fmt::v10::vformat_abi_cxx11_(&local_580,local_2b8,fmt_01,args_01);
        std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_580);
        local_5b1 = 0;
        __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pack_native_tile::anon_class_1_0_00000001::operator()(&local_560,&local_3ea,data,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&local_560);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_560);
    }
  }
  else if ((mode == ngp) || (mode == ngpc)) {
    if ((width != 8) || (uStack_3e8 != 8)) {
      local_609 = 1;
      auVar5 = __cxa_allocate_exception(0x10);
      local_5e8 = (v10 *)0x1d8ffc;
      local_5e0 = (char *)0x48;
      pvVar3 = (v10 *)(ulong)mode;
      mode_abi_cxx11_(&local_608,(sfc *)pvVar3,auVar5._8_4_);
      local_2e0 = &local_5d8;
      local_2f0 = local_5e8;
      pcStack_2e8 = local_5e0;
      local_2f8 = &local_608;
      local_180 = &local_2f0;
      local_308 = local_5e8;
      local_300 = local_5e0;
      local_178 = local_308;
      pcStack_170 = local_300;
      local_328[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_2f8,pvVar3,local_2e0);
      local_f0 = local_318;
      local_f8 = local_328;
      local_60 = 0xd;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = local_300;
      args_02.field_1.values_ = aVar4.values_;
      args_02.desc_ = (unsigned_long_long)local_f8;
      local_b8 = local_f8;
      local_68 = local_f8;
      local_58 = local_f0;
      ::fmt::v10::vformat_abi_cxx11_(&local_5d8,local_308,fmt_02,args_02);
      std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_5d8);
      local_609 = 0;
      __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp != 2) {
      local_679 = 1;
      auVar5 = __cxa_allocate_exception(0x10);
      local_658 = (v10 *)0x1d8f95;
      local_650 = (char *)0x30;
      pvVar3 = (v10 *)(ulong)mode;
      mode_abi_cxx11_(&local_678,(sfc *)pvVar3,auVar5._8_4_);
      local_330 = &local_648;
      local_340 = local_658;
      pcStack_338 = local_650;
      local_348 = &local_678;
      local_160 = &local_340;
      local_358 = local_658;
      local_350 = local_650;
      local_158 = local_358;
      pcStack_150 = local_350;
      local_378[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_348,pvVar3,local_330);
      local_e0 = local_368;
      local_e8 = local_378;
      local_78 = 0xd;
      fmt_03.size_ = 0xd;
      fmt_03.data_ = local_350;
      args_03.field_1.values_ = aVar4.values_;
      args_03.desc_ = (unsigned_long_long)local_e8;
      local_c0 = local_e8;
      local_80 = local_e8;
      local_70 = local_e0;
      ::fmt::v10::vformat_abi_cxx11_(&local_648,local_358,fmt_03,args_03);
      std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_648);
      local_679 = 0;
      __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pack_native_tile::anon_class_1_0_00000001::operator()(&local_628,&local_3ed,data,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_628);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_628);
  }
  else if (mode == snes_mode7) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,data);
  }
  else if ((((mode == gba) || (mode == gba_affine)) || (mode == md)) || (mode == wsc_packed)) {
    if (bpp == 8) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,data);
    }
    else {
      if (bpp != 4) {
        plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        auVar5 = __cxa_allocate_exception(0x10);
        local_6c8 = (v10 *)0x1d8f95;
        local_6c0 = (char *)0x30;
        pvVar3 = (v10 *)(ulong)mode;
        mode_abi_cxx11_((string *)&p,(sfc *)pvVar3,auVar5._8_4_);
        local_380 = &local_6b8;
        local_390 = local_6c8;
        pcStack_388 = local_6c0;
        local_398 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&p;
        local_140 = &local_390;
        local_3a8 = local_6c8;
        local_3a0 = local_6c0;
        local_138 = local_3a8;
        pcStack_130 = local_3a0;
        nd = (byte_vec_t *)
             ::fmt::v10::
             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                       (local_398,pvVar3,local_380);
        local_d0 = local_3b8;
        local_d8 = &nd;
        local_90 = 0xd;
        fmt_04.size_ = 0xd;
        fmt_04.data_ = local_3a0;
        args_04.field_1.values_ = aVar4.values_;
        args_04.desc_ = (unsigned_long_long)local_d8;
        local_c8 = local_d8;
        local_98 = local_d8;
        local_88 = local_d0;
        ::fmt::v10::vformat_abi_cxx11_(&local_6b8,local_3a8,fmt_04,args_04);
        std::runtime_error::runtime_error(auVar5._0_8_,(string *)&local_6b8);
        plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(auVar5._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pack_native_tile::anon_class_1_0_00000001::operator()
                (&local_698,&local_3ec,data,mode == wsc_packed);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&local_698);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_698);
    }
  }
  else if (mode == pce_sprite) {
    for (plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < 4;
        plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 1) {
      pack_native_tile::anon_class_1_0_00000001::operator()
                ((byte_vec_t *)local_708,&local_3eb,data,
                 (uint)plane_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,false);
      local_718._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_710,&local_718);
      iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_708);
      iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_708);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 local_710,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar1._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar2._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_708);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline byte_vec_t pack_native_tile(const index_vec_t& data, Mode mode, unsigned bpp, unsigned width, unsigned height) {

  // wsc/sms/gg planar style bit planes
  auto make_4bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(32);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;
    index_t mask2 = mask1 << 1;
    index_t mask3 = mask2 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;
    unsigned shift2 = plane_index + 2;
    unsigned shift3 = plane_index + 3;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 4 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 4 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
        p[y * 4 + 2] |= ((in_data[y * 8 + x] & mask2) >> shift2) << (7 - x);
        p[y * 4 + 3] |= ((in_data[y * 8 + x] & mask3) >> shift3) << (7 - x);
      }
    }
    return p;
  };

  // snes/gameboy style bit planes
  auto make_2bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 2 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 2 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
      }
    }
    return p;
  };

  // regular bit planes
  auto make_1bit_planes = [](const index_vec_t& in_data, unsigned plane, bool reverse) {
    if (in_data.size() % 8)
      throw std::runtime_error("programmer error (in_data not multiple of 8 in make_1bit_planes)");

    size_t plane_size = in_data.size() >> 3;
    byte_vec_t p(plane_size);

    index_t mask = 1;
    for (unsigned i = 0; i < plane; ++i)
      mask <<= 1;

    for (unsigned index_b = 0, index_i = 0; index_b < plane_size; ++index_b) {
      index_t byte = 0;
      for (unsigned b = 0; b < 8; ++b) {
        if (in_data[index_i + b] & mask) {
          if (reverse)
            byte |= 1 << (7-b);
          else
            byte |= 1 << b;
        }
      }
      p[index_b] = byte;
      index_i += 8;
    }
    return p;
  };

  // gba/md style 2 pixels per byte data
  auto make_4bpp_bitpack = [](const index_vec_t& in_data, bool endian_swap) {
    if (in_data.size() % 2)
      throw std::runtime_error("programmer error (in_data not multiple of 2 in make_4bpp_bitpack)");

    byte_vec_t bv(in_data.size() >> 1);
    if (endian_swap) {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[(i << 1) + 1]) | (0xf0 & (in_data[i << 1] << 4));

    } else {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[i << 1]) | (0xf0 & (in_data[(i << 1) + 1] << 4));

    }
    return bv;
  };

  // vb/ngp style 4 pixels per byte data
  auto make_2bpp_bitpack = [](const index_vec_t& in_data, bool reverse) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        unsigned px = reverse ? 7 - x : x;
        p[(y << 1) | (px >> 2)] |= (in_data[y * 8 + x] & 0x03) << ((px << 1) & 6);
      }
    }
    return p;
  };

  byte_vec_t nd;

  if (mode == Mode::snes || mode == Mode::gb || mode == Mode::gbc || mode == Mode::pce) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    unsigned planes = bpp >> 1;
    for (unsigned i = 0; i < planes; ++i) {
      auto plane = make_2bit_planes(data, i * 2);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
    // 1bpp had 0 iterations
    if(bpp == 1) {
      auto plane = make_1bit_planes(data, 0, true);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }

  } else if (mode == Mode::ws || mode == Mode::wsc || mode == Mode::gg || mode == Mode::sms) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 4) {
      nd = make_4bit_planes(data, 0);
    } else if (bpp == 2) {
      nd = make_2bit_planes(data, 0);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::ngp || mode == Mode::ngpc) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 2) {
      nd = make_2bpp_bitpack(data, true);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::snes_mode7) {
    nd = data;

  } else if (mode == Mode::gba || mode == Mode::gba_affine || mode == Mode::md || mode == Mode::wsc_packed) {
    if (bpp == 8) {
      nd = data;
    } else if (bpp == 4) {
      nd = make_4bpp_bitpack(data, mode == Mode::wsc_packed);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::pce_sprite) {
    for (unsigned p = 0; p < 4; ++p) {
      auto plane = make_1bit_planes(data, p, false);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
  }

  return nd;
}